

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintFieldDescriptor
          (Generator *this,FieldDescriptor *field,bool is_extension)

{
  float value;
  double value_00;
  FieldDescriptor FVar1;
  long lVar2;
  Type TVar3;
  CppType CVar4;
  mapped_type *pmVar5;
  EnumValueDescriptor *pEVar6;
  LogMessage *other;
  int __c;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  AlphaNum *a_03;
  AlphaNum *a_04;
  AlphaNum *a_05;
  AlphaNum *a_06;
  AlphaNum *a_07;
  AlphaNum *a_08;
  char *pcVar7;
  allocator local_289;
  key_type local_288;
  string local_268;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  char field_descriptor_decl [455];
  string options_string;
  
  options_string._M_dataplus._M_p = (pointer)&options_string.field_2;
  options_string._M_string_length = 0;
  options_string.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString(*(MessageLite **)(field + 0x38),&options_string);
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &m._M_t._M_impl.super__Rb_tree_header._M_header;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)field_descriptor_decl,"name",(allocator *)&local_268);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)field_descriptor_decl);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  std::__cxx11::string::~string((string *)field_descriptor_decl);
  lVar2 = *(long *)(field + 8);
  std::__cxx11::string::string((string *)field_descriptor_decl,"full_name",(allocator *)&local_268);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)field_descriptor_decl);
  pcVar7 = (char *)(lVar2 + 0x20);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  std::__cxx11::string::~string((string *)field_descriptor_decl);
  pcVar7 = FieldDescriptor::index(field,pcVar7,__c);
  strings::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,(int)pcVar7);
  StrCat_abi_cxx11_(&local_268,(protobuf *)field_descriptor_decl,a);
  std::__cxx11::string::string((string *)&local_288,"index",&local_289);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,&local_288);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  strings::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,*(int *)(field + 4));
  StrCat_abi_cxx11_(&local_268,(protobuf *)field_descriptor_decl,a_00);
  std::__cxx11::string::string((string *)&local_288,"number",&local_289);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,&local_288);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  TVar3 = FieldDescriptor::type(field);
  strings::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,TVar3);
  StrCat_abi_cxx11_(&local_268,(protobuf *)field_descriptor_decl,a_01);
  std::__cxx11::string::string((string *)&local_288,"type",&local_289);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,&local_288);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  CVar4 = FieldDescriptor::cpp_type(field);
  strings::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,CVar4);
  StrCat_abi_cxx11_(&local_268,(protobuf *)field_descriptor_decl,a_02);
  std::__cxx11::string::string((string *)&local_288,"cpp_type",&local_289);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,&local_288);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  strings::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,(byte)field[1] >> 5 & 3);
  StrCat_abi_cxx11_(&local_268,(protobuf *)field_descriptor_decl,a_03);
  std::__cxx11::string::string((string *)&local_288,"label",&local_289);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,&local_288);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  pcVar7 = "False";
  if (((byte)field[1] & 1) != 0) {
    pcVar7 = "True";
  }
  std::__cxx11::string::string
            ((string *)field_descriptor_decl,"has_default_value",(allocator *)&local_268);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)field_descriptor_decl);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)field_descriptor_decl);
  if ((~(byte)field[1] & 0x60) == 0) {
    std::__cxx11::string::string((string *)&local_288,"[]",(allocator *)field_descriptor_decl);
    goto LAB_002c500d;
  }
  CVar4 = FieldDescriptor::cpp_type(field);
  switch(CVar4) {
  case CPPTYPE_INT32:
    strings::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,*(int *)(field + 0x40));
    StrCat_abi_cxx11_(&local_288,(protobuf *)field_descriptor_decl,a_04);
    break;
  case CPPTYPE_INT64:
    strings::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,*(long *)(field + 0x40));
    StrCat_abi_cxx11_(&local_288,(protobuf *)field_descriptor_decl,a_08);
    break;
  case CPPTYPE_UINT32:
    strings::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,*(uint *)(field + 0x40));
    StrCat_abi_cxx11_(&local_288,(protobuf *)field_descriptor_decl,a_05);
    break;
  case CPPTYPE_UINT64:
    strings::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,*(unsigned_long *)(field + 0x40));
    StrCat_abi_cxx11_(&local_288,(protobuf *)field_descriptor_decl,a_06);
    break;
  case CPPTYPE_DOUBLE:
    value_00 = *(double *)(field + 0x40);
    if (INFINITY <= value_00) {
      std::__cxx11::string::string
                ((string *)&local_288,"1e10000",(allocator *)field_descriptor_decl);
      break;
    }
    if (value_00 <= -INFINITY) {
      std::__cxx11::string::string
                ((string *)&local_288,"-1e10000",(allocator *)field_descriptor_decl);
      break;
    }
    if (NAN(value_00)) {
      std::__cxx11::string::string
                ((string *)&local_288,"(1e10000 * 0)",(allocator *)field_descriptor_decl);
      break;
    }
    SimpleDtoa_abi_cxx11_(&local_268,(protobuf *)pcVar7,value_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   field_descriptor_decl,"float(",&local_268);
    std::operator+(&local_288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   field_descriptor_decl,")");
    goto LAB_002c546d;
  case CPPTYPE_FLOAT:
    value = *(float *)(field + 0x40);
    if (INFINITY <= value) {
      std::__cxx11::string::string
                ((string *)&local_288,"1e10000",(allocator *)field_descriptor_decl);
      break;
    }
    if (value <= -INFINITY) {
      std::__cxx11::string::string
                ((string *)&local_288,"-1e10000",(allocator *)field_descriptor_decl);
      break;
    }
    if (NAN(value)) {
      std::__cxx11::string::string
                ((string *)&local_288,"(1e10000 * 0)",(allocator *)field_descriptor_decl);
      break;
    }
    SimpleFtoa_abi_cxx11_(&local_268,(protobuf *)pcVar7,value);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   field_descriptor_decl,"float(",&local_268);
    std::operator+(&local_288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   field_descriptor_decl,")");
    goto LAB_002c546d;
  case CPPTYPE_BOOL:
    pcVar7 = "False";
    if (field[0x40] != (FieldDescriptor)0x0) {
      pcVar7 = "True";
    }
    std::__cxx11::string::string((string *)&local_288,pcVar7,(allocator *)field_descriptor_decl);
    break;
  case CPPTYPE_ENUM:
    pEVar6 = FieldDescriptor::default_value_enum(field);
    strings::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,*(int *)(pEVar6 + 4));
    StrCat_abi_cxx11_(&local_288,(protobuf *)field_descriptor_decl,a_07);
    break;
  case CPPTYPE_STRING:
    CEscape(&local_268,*(string **)(field + 0x40));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   field_descriptor_decl,"b\"",&local_268);
    TVar3 = FieldDescriptor::type(field);
    pcVar7 = "\"";
    if (TVar3 == TYPE_STRING) {
      pcVar7 = "\".decode(\'utf-8\')";
    }
    std::operator+(&local_288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   field_descriptor_decl,pcVar7);
LAB_002c546d:
    std::__cxx11::string::~string((string *)field_descriptor_decl);
    std::__cxx11::string::~string((string *)&local_268);
    break;
  case CPPTYPE_MESSAGE:
    std::__cxx11::string::string((string *)&local_288,"None",(allocator *)field_descriptor_decl);
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)field_descriptor_decl,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x10f);
    other = internal::LogMessage::operator<<((LogMessage *)field_descriptor_decl,"Not reached.");
    internal::LogFinisher::operator=((LogFinisher *)&local_268,other);
    internal::LogMessage::~LogMessage((LogMessage *)field_descriptor_decl);
    std::__cxx11::string::string((string *)&local_288,"",(allocator *)field_descriptor_decl);
  }
LAB_002c500d:
  std::__cxx11::string::string
            ((string *)field_descriptor_decl,"default_value",(allocator *)&local_268);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)field_descriptor_decl);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_288);
  std::__cxx11::string::~string((string *)field_descriptor_decl);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::string
            ((string *)field_descriptor_decl,"is_extension",(allocator *)&local_268);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)field_descriptor_decl);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)field_descriptor_decl);
  OptionsValue((string *)field_descriptor_decl,this,&options_string);
  std::__cxx11::string::string((string *)&local_268,"serialized_options",(allocator *)&local_288);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,&local_268);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)field_descriptor_decl);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)field_descriptor_decl);
  FVar1 = field[1];
  if (((byte)FVar1 & 4) == 0) {
    std::__cxx11::string::string((string *)field_descriptor_decl,"",(allocator *)&local_268);
  }
  else {
    std::operator+(&local_268,", json_name=\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(((byte)field[3] & 0x70) * 2) + *(long *)(field + 8)));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   field_descriptor_decl,&local_268,"\'");
  }
  std::__cxx11::string::string((string *)&local_288,"json_name",&local_289);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,&local_288);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)field_descriptor_decl);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)field_descriptor_decl);
  if (((byte)FVar1 & 4) != 0) {
    std::__cxx11::string::~string((string *)&local_268);
  }
  memcpy(field_descriptor_decl,
         "_descriptor.FieldDescriptor(\n  name=\'$name$\', full_name=\'$full_name$\', index=$index$,\n  number=$number$, type=$type$, cpp_type=$cpp_type$, label=$label$,\n  has_default_value=$has_default_value$, default_value=$default_value$,\n  message_type=None, enum_type=None, containing_type=None,\n  is_extension=$is_extension$, extension_scope=None,\n  serialized_options=$serialized_options$$json_name$, file=DESCRIPTOR,  create_key=_descriptor._internal_create_key)"
         ,0x1c7);
  io::Printer::Print(this->printer_,&m,field_descriptor_decl);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&m._M_t);
  std::__cxx11::string::~string((string *)&options_string);
  return;
}

Assistant:

void Generator::PrintFieldDescriptor(const FieldDescriptor& field,
                                     bool is_extension) const {
  std::string options_string;
  field.options().SerializeToString(&options_string);
  std::map<std::string, std::string> m;
  m["name"] = field.name();
  m["full_name"] = field.full_name();
  m["index"] = StrCat(field.index());
  m["number"] = StrCat(field.number());
  m["type"] = StrCat(field.type());
  m["cpp_type"] = StrCat(field.cpp_type());
  m["label"] = StrCat(field.label());
  m["has_default_value"] = field.has_default_value() ? "True" : "False";
  m["default_value"] = StringifyDefaultValue(field);
  m["is_extension"] = is_extension ? "True" : "False";
  m["serialized_options"] = OptionsValue(options_string);
  m["json_name"] =
      field.has_json_name() ? ", json_name='" + field.json_name() + "'" : "";
  // We always set message_type and enum_type to None at this point, and then
  // these fields in correctly after all referenced descriptors have been
  // defined and/or imported (see FixForeignFieldsInDescriptors()).
  const char field_descriptor_decl[] =
      "_descriptor.FieldDescriptor(\n"
      "  name='$name$', full_name='$full_name$', index=$index$,\n"
      "  number=$number$, type=$type$, cpp_type=$cpp_type$, label=$label$,\n"
      "  has_default_value=$has_default_value$, "
      "default_value=$default_value$,\n"
      "  message_type=None, enum_type=None, containing_type=None,\n"
      "  is_extension=$is_extension$, extension_scope=None,\n"
      "  serialized_options=$serialized_options$$json_name$, file=DESCRIPTOR,"
      "  create_key=_descriptor._internal_create_key)";
  printer_->Print(m, field_descriptor_decl);
}